

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtariST.cpp
# Opt level: O1

void __thiscall Atari::ST::ConcreteMachine::set_gpip_input(ConcreteMachine *this)

{
  atomic_flag *paVar1;
  JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749> *pJVar2;
  MFP68901 *this_00;
  __atomic_flag_data_type _Var3;
  ulong uVar4;
  HalfCycles duration;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  char *__function;
  unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
  local_30;
  
  LOCK();
  paVar1 = &(this->mfp_).flush_concurrency_check_;
  _Var3 = (paVar1->super___atomic_flag_base)._M_i;
  (paVar1->super___atomic_flag_base)._M_i = true;
  UNLOCK();
  if (_Var3 == false) {
    pJVar2 = &this->mfp_;
    if ((this->mfp_).is_flushed_ == false) {
      (this->mfp_).is_flushed_ = true;
      (this->mfp_).did_flush_ = true;
      uVar4 = (this->mfp_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
      (this->mfp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = (long)uVar4 % 0x28cc55;
      if (0x28cc54 < (long)uVar4) {
        Motorola::MFP68901::MFP68901::run_for(&(this->mfp_).object_,(HalfCycles)(uVar4 / 0x28cc55));
      }
    }
    LOCK();
    (this->mfp_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
    UNLOCK();
    this_00 = &(this->mfp_).object_;
    LOCK();
    paVar1 = &(this->dma_).flush_concurrency_check_;
    _Var3 = (paVar1->super___atomic_flag_base)._M_i;
    (paVar1->super___atomic_flag_base)._M_i = true;
    UNLOCK();
    local_30._M_t.
    super___uniq_ptr_impl<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_Motorola::MFP68901::MFP68901_*,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
    .
    super__Tuple_impl<1UL,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
    .
    super__Head_base<1UL,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter,_false>
    ._M_head_impl.actor_ =
         (_Head_base<1UL,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter,_false>
          )(_Head_base<1UL,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter,_false>
            )pJVar2;
    local_30._M_t.
    super___uniq_ptr_impl<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_Motorola::MFP68901::MFP68901_*,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
    .super__Head_base<0UL,_Motorola::MFP68901::MFP68901_*,_false>._M_head_impl = this_00;
    if (_Var3 == false) {
      if ((this->dma_).is_flushed_ == false) {
        (this->dma_).is_flushed_ = true;
        (this->dma_).did_flush_ = true;
        duration.super_WrappedInt<HalfCycles>.length_ =
             (WrappedInt<HalfCycles>)
             (this->dma_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
        (this->dma_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
        DMAController::run_for(&(this->dma_).object_,duration);
      }
      LOCK();
      (this->dma_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
      UNLOCK();
      bVar5 = DMAController::get_interrupt_line(&(this->dma_).object_);
      LOCK();
      paVar1 = &(this->keyboard_acia_).flush_concurrency_check_;
      _Var3 = (paVar1->super___atomic_flag_base)._M_i;
      (paVar1->super___atomic_flag_base)._M_i = true;
      UNLOCK();
      if (_Var3 == false) {
        JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::flush(&this->keyboard_acia_);
        LOCK();
        (this->keyboard_acia_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
        UNLOCK();
        bVar6 = Motorola::ACIA::ACIA::get_interrupt_line(&(this->keyboard_acia_).object_);
        bVar7 = true;
        if (bVar6) {
LAB_0030395e:
          Motorola::MFP68901::MFP68901::set_port_input
                    (this_00,~bVar5 << 5 | (bVar7 ^ 1U) << 4 | 0xce);
          std::
          unique_ptr<Motorola::MFP68901::MFP68901,_JustInTimeActor<Motorola::MFP68901::MFP68901,_HalfCycles,_819200,_2673749>::SequencePointAwareDeleter>
          ::~unique_ptr(&local_30);
          return;
        }
        LOCK();
        paVar1 = &(this->midi_acia_).flush_concurrency_check_;
        _Var3 = (paVar1->super___atomic_flag_base)._M_i;
        (paVar1->super___atomic_flag_base)._M_i = true;
        UNLOCK();
        if (_Var3 == false) {
          JustInTimeActor<Motorola::ACIA::ACIA,_HalfCycles,_16,_1>::flush(&this->midi_acia_);
          LOCK();
          (this->midi_acia_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
          UNLOCK();
          bVar7 = Motorola::ACIA::ACIA::get_interrupt_line(&(this->midi_acia_).object_);
          goto LAB_0030395e;
        }
      }
      __function = 
      "auto JustInTimeActor<Motorola::ACIA::ACIA, HalfCycles, 16>::operator->() [T = Motorola::ACIA::ACIA, LocalTimeScale = HalfCycles, multiplier = 16, divider = 1]"
      ;
    }
    else {
      __function = 
      "auto JustInTimeActor<Atari::ST::DMAController>::operator->() [T = Atari::ST::DMAController, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
      ;
    }
  }
  else {
    __function = 
    "auto JustInTimeActor<Motorola::MFP68901::MFP68901, HalfCycles, 819200, 2673749>::operator->() [T = Motorola::MFP68901::MFP68901, LocalTimeScale = HalfCycles, multiplier = 819200, divider = 2673749]"
    ;
  }
  __assert_fail("!flush_concurrency_check_.test_and_set()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Atari/ST/../../../ClockReceiver/JustInTime.hpp"
                ,0x7e,__function);
}

Assistant:

void set_gpip_input() {
			/*
				Atari ST GPIP bits:

					GPIP 7: monochrome monitor detect
					GPIP 6: RS-232 ring indicator
					GPIP 5: FD/HD interrupt
					GPIP 4: keyboard/MIDI interrupt
					GPIP 3: unused
					GPIP 2: RS-232 clear to send
					GPIP 1: RS-232 carrier detect
					GPIP 0: centronics busy
			*/
			mfp_->set_port_input(
				0x80 |	// b7: Monochrome monitor detect (0 = is monochrome).
				0x40 |	// b6: RS-232 ring indicator.
				(dma_->get_interrupt_line() ? 0x00 : 0x20) |	// b5: FD/HS interrupt (0 = interrupt requested).
				((keyboard_acia_->get_interrupt_line() || midi_acia_->get_interrupt_line()) ? 0x00 : 0x10) |	// b4: Keyboard/MIDI interrupt (0 = interrupt requested).
				0x08 |	// b3: Unused
				0x04 |	// b2: RS-232 clear to send.
				0x02 |	// b1 : RS-232 carrier detect.
				0x00	// b0: Centronics busy (1 = busy).
			);
		}